

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processPriorityCommand(CoreBroker *this)

{
  ActionMessage *in_stack_00000710;
  CoreBroker *in_stack_00000718;
  
  processPriorityCommand(in_stack_00000718,in_stack_00000710);
  return;
}

Assistant:

void CoreBroker::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            } else {
                routeMessage(command);
            }
            break;
        case CMD_BROKER_SETUP: {
            global_broker_id_local = global_id.load();
            isRootc = _isRoot.load();
            timeCoord->setSourceId(global_broker_id_local);
            connectionEstablished = true;
            if (!earlyMessages.empty()) {
                for (auto& message : earlyMessages) {
                    if (isPriorityCommand(message)) {
                        processPriorityCommand(std::move(message));
                    } else {
                        processCommand(std::move(message));
                    }
                }
                earlyMessages.clear();
            }
            break;
        }
        case CMD_REG_FED:
            fedRegistration(std::move(command));
            break;
        case CMD_REG_BROKER:
            brokerRegistration(std::move(command));
            break;
        case CMD_FED_ACK: {  // we can't be root if we got one of these
            auto fed = mFederates.find(command.name());
            if (fed != mFederates.end()) {
                auto route = fed->route;
                if (!fed->global_id.isValid()) {
                    fed->global_id = command.dest_id;
                    mFederates.addSearchTerm(command.dest_id, fed->name);
                }
                transmit(route, command);
                routing_table.emplace(fed->global_id, route);
                if (enable_profiling) {
                    ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                                     global_broker_id_local,
                                                     command.dest_id);
                    setActionFlag(fedEnableProfiling, indicator_flag);
                    transmit(route, fedEnableProfiling);
                }
            } else {
                // this means we haven't seen this federate before for some reason
                mFederates.insert(command.name(), command.dest_id, command.name());
                mFederates.back().route = getRoute(command.source_id);
                mFederates.back().global_id = command.dest_id;
                routing_table.emplace(fed->global_id, mFederates.back().route);
                // it also means we don't forward it
            }

        } break;
        case CMD_BROKER_ACK: {  // we can't be root if we got one of these
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    // generate an error message
                    LOG_ERROR(global_broker_id_local,
                              identifier,
                              fmt::format("unable to register broker {}",
                                          command.payload.to_string()));
                    return;
                }

                global_broker_id_local = command.dest_id;
                global_id.store(global_broker_id_local);
                higher_broker_id = command.source_id;
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                timeCoord->setSourceId(global_broker_id_local);
                transmitDelayedMessages();
                mBrokers.apply([localid = global_broker_id_local](auto& brk) {
                    if (!brk._nonLocal) {
                        brk.parent = localid;
                    }
                });

                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                timeoutMon->reset();
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                return;
            }
            auto broker = mBrokers.find(command.name());
            if (broker != mBrokers.end()) {
                if (broker->global_id == GlobalBrokerId{command.dest_id}) {
                    // drop the packet since we have seen this ack already
                    LOG_WARNING(global_broker_id_local, identifier, "repeated broker acks");
                    return;
                }
                broker->global_id = GlobalBrokerId{command.dest_id};
                auto route = broker->route;
                mBrokers.addSearchTerm(GlobalBrokerId{command.dest_id}, broker->name);
                routing_table.emplace(broker->global_id, route);
                command.source_id = global_broker_id_local;  // we want the intermediate broker to
                                                             // change the source_id
                transmit(route, command);
            } else {
                mBrokers.insert(command.name(), GlobalBrokerId{command.dest_id}, command.name());
                mBrokers.back().route = getRoute(command.source_id);
                mBrokers.back().global_id = GlobalBrokerId{command.dest_id};
                routing_table.emplace(broker->global_id, mBrokers.back().route);
            }
        } break;
        case CMD_PRIORITY_DISCONNECT: {
            auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
            if (brk != nullptr) {
                brk->state = ConnectionState::DISCONNECTED;
            }
            if (getAllConnectionState() >= ConnectionState::DISCONNECTED) {
                if (!isRootc) {
                    ActionMessage dis(CMD_PRIORITY_DISCONNECT);
                    dis.source_id = global_broker_id_local;
                    transmit(parent_route_id, dis);
                }
                addActionMessage(CMD_STOP);
            }
        } break;
        case CMD_REG_ROUTE:
            break;
        case CMD_SEND_COMMAND:
            processCommandInstruction(command);
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
        case CMD_SET_GLOBAL:
            processQueryCommand(command);
            break;

        default:
            // must not have been a priority command
            break;
    }
}